

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64_t __thiscall google::protobuf::internal::ThreadSafeArena::SpaceUsed(ThreadSafeArena *this)

{
  uint64_t uVar1;
  SerialArena *this_00;
  uint64_t uVar2;
  
  uVar2 = 0;
  for (this_00 = *(SerialArena **)(this + 0x10); this_00 != (SerialArena *)0x0;
      this_00 = this_00->next_) {
    uVar1 = SerialArena::SpaceUsed(this_00);
    uVar2 = uVar2 + uVar1;
  }
  uVar1 = uVar2 - 0x28;
  if (*(ulong *)(this + 8) < 8) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

uint64_t ThreadSafeArena::SpaceUsed() const {
  SerialArena* serial = threads_.load(std::memory_order_acquire);
  uint64_t space_used = 0;
  for (; serial; serial = serial->next()) {
    space_used += serial->SpaceUsed();
  }
  return space_used - (alloc_policy_.get() ? sizeof(AllocationPolicy) : 0);
}